

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&> * __thiscall
Catch::ExprLhs<std::bitset<512ul>const&>::operator==
          (BinaryExpr<const_std::bitset<512UL>_&,_const_std::bitset<512UL>_&>
           *__return_storage_ptr__,ExprLhs<std::bitset<512ul>const&> *this,bitset<512UL> *rhs)

{
  bitset<512UL> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = std::_Base_bitset<8UL>::_M_is_equal
                    (*(_Base_bitset<8UL> **)this,&rhs->super__Base_bitset<8UL>);
  pbVar1 = *(bitset<512UL> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0099a160;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }